

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_print_util.c
# Opt level: O0

void libpd_print_concatenator(char *s)

{
  void *pvVar1;
  int iVar2;
  size_t sVar3;
  int local_1c;
  int d;
  int len;
  print_util *util;
  char *s_local;
  
  pvVar1 = libpd_mainimp.i_print_util;
  if (libpd_mainimp.i_print_util != (void *)0x0) {
    *(undefined1 *)
     ((long)libpd_mainimp.i_print_util +
     (long)*(int *)((long)libpd_mainimp.i_print_util + 0x808) + 8) = 0;
    sVar3 = strlen(s);
    local_1c = (int)sVar3;
    util = (print_util *)s;
    while (0x7ff < *(int *)((long)pvVar1 + 0x808) + local_1c) {
      iVar2 = 0x7ff - *(int *)((long)pvVar1 + 0x808);
      strncat((char *)((long)pvVar1 + 8),(char *)util,(long)iVar2);
      (**pvVar1)((long)pvVar1 + 8);
      util = (print_util *)(util->concat_buf + (long)iVar2 + -8);
      local_1c = local_1c - iVar2;
      *(undefined4 *)((long)pvVar1 + 0x808) = 0;
      *(undefined1 *)((long)pvVar1 + 8) = 0;
    }
    strncat((char *)((long)pvVar1 + 8),(char *)util,(long)local_1c);
    *(int *)((long)pvVar1 + 0x808) = local_1c + *(int *)((long)pvVar1 + 0x808);
    if ((0 < *(int *)((long)pvVar1 + 0x808)) &&
       (*(char *)((long)pvVar1 + (long)(*(int *)((long)pvVar1 + 0x808) + -1) + 8) == '\n')) {
      *(undefined1 *)((long)pvVar1 + (long)(*(int *)((long)pvVar1 + 0x808) + -1) + 8) = 0;
      (**pvVar1)((long)pvVar1 + 8);
      *(undefined4 *)((long)pvVar1 + 0x808) = 0;
    }
  }
  return;
}

Assistant:

void libpd_print_concatenator(const char *s) {
  print_util *util = (print_util *)LIBPDSTUFF->i_print_util;
  if (!util) return;

  util->concat_buf[util->concat_len] = '\0';

  int len = (int)strlen(s);
  while (util->concat_len + len >= PRINT_LINE_SIZE) {
    int d = PRINT_LINE_SIZE - 1 - util->concat_len;
    strncat(util->concat_buf, s, d);
    util->concat_printhook(util->concat_buf);
    s += d;
    len -= d;
    util->concat_len = 0;
    util->concat_buf[0] = '\0';
  }

  strncat(util->concat_buf, s, len);
  util->concat_len += len;

  if (util->concat_len > 0 && util->concat_buf[util->concat_len - 1] == '\n') {
    util->concat_buf[util->concat_len - 1] = '\0';
    util->concat_printhook(util->concat_buf);
    util->concat_len = 0;
  }
}